

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ElementSelectExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ElementSelectExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,Expression *args_1,Expression *args_2,SourceRange *args_3)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  ElementSelectExpression *pEVar3;
  
  pEVar3 = (ElementSelectExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ElementSelectExpression *)this->endPtr < pEVar3 + 1) {
    pEVar3 = (ElementSelectExpression *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pEVar3 + 1);
  }
  SVar1 = args_3->startLoc;
  SVar2 = args_3->endLoc;
  (pEVar3->super_Expression).kind = ElementSelect;
  (pEVar3->super_Expression).type.ptr = args;
  (pEVar3->super_Expression).constant = (ConstantValue *)0x0;
  (pEVar3->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pEVar3->super_Expression).sourceRange.startLoc = SVar1;
  (pEVar3->super_Expression).sourceRange.endLoc = SVar2;
  pEVar3->value_ = args_1;
  pEVar3->selector_ = args_2;
  pEVar3->warnedAboutIndex = false;
  return pEVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }